

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O3

void __thiscall
OpenMD::Electrostatic::calcSurfaceTerm(Electrostatic *this,bool slabGeometry,int axis,RealType *pot)

{
  double *pdVar1;
  bool bVar2;
  Atom *pAVar3;
  pointer pEVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  double dVar7;
  uint i;
  int iVar8;
  Molecule *pMVar9;
  undefined4 in_register_00000014;
  long lVar10;
  long lVar11;
  undefined7 in_register_00000031;
  pointer ppAVar12;
  double tmp;
  RealType RVar13;
  double dVar14;
  Vector<double,_3U> result;
  MoleculeIterator mi;
  Vector3d r;
  Vector3d D;
  Vector3d t;
  double local_130;
  double local_128 [4];
  double local_108 [3];
  MoleculeIterator local_f0;
  double local_e8 [2];
  undefined8 local_d8;
  Vector3d local_c8;
  double local_a8 [4];
  double local_88;
  double dStack_80;
  double local_78;
  undefined8 uStack_70;
  double *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  RealType local_50;
  double local_48 [3];
  
  local_88 = (double)CONCAT44(in_register_00000014,axis);
  local_78 = (double)CONCAT44(local_78._4_4_,(int)CONCAT71(in_register_00000031,slabGeometry));
  local_f0._M_node = (_Base_ptr)0x0;
  local_c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_a8[2] = 0.0;
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_48[2] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_d8 = 0.0;
  local_e8[0] = 0.0;
  local_e8[1] = 0.0;
  local_68 = pot;
  if (this->initialized_ == false) {
    initialize(this);
  }
  pMVar9 = SimInfo::beginMolecule(this->info_,&local_f0);
  if (pMVar9 != (Molecule *)0x0) {
    do {
      for (ppAVar12 = (pMVar9->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (ppAVar12 !=
           (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
           _M_impl.super__Vector_impl_data._M_finish && (pAVar3 = *ppAVar12, pAVar3 != (Atom *)0x0))
          ; ppAVar12 = ppAVar12 + 1) {
        iVar8 = AtomType::getIdent(pAVar3->atomType_);
        pEVar4 = (this->ElectrostaticMap).
                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8];
        bVar2 = pEVar4[iVar8].is_Dipole;
        if ((pEVar4[iVar8].is_Charge & 1U) != 0) {
          local_130 = pEVar4[iVar8].fixedCharge;
          DVar5 = (pAVar3->super_StuntDouble).storage_;
          pSVar6 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
          if ((pEVar4[iVar8].is_Fluctuating & 1U) == 0) {
            lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_;
          }
          else {
            lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_;
            local_130 = local_130 +
                        *(double *)
                         (*(long *)((long)&(pSVar6->atomData).flucQPos.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start + DVar5) +
                         lVar10 * 8);
          }
          lVar11 = *(long *)((long)&(pSVar6->atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + DVar5);
          pdVar1 = (double *)(lVar11 + lVar10 * 0x18);
          local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
          local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
          local_c8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar11 + 0x10 + lVar10 * 0x18);
          Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_c8);
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar10 = 0;
          do {
            local_128[lVar10] = local_c8.super_Vector<double,_3U>.data_[lVar10] * local_130;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar10 = 0;
          do {
            local_e8[lVar10] = local_128[lVar10] + local_e8[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
        }
        if ((bVar2 & 1U) != 0) {
          lVar11 = (long)(pAVar3->super_StuntDouble).localIndex_;
          lVar10 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).dipole.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar3->super_StuntDouble).storage_);
          local_108[2] = *(double *)(lVar10 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar10 + lVar11 * 0x18);
          local_108[0] = *pdVar1;
          local_108[1] = pdVar1[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar10 = 0;
          do {
            local_128[lVar10] = local_108[lVar10] * 0.20819434;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_a8[2] = local_128[2];
          local_a8[0] = local_128[0];
          local_a8[1] = local_128[1];
          lVar10 = 0;
          do {
            local_e8[lVar10] = local_a8[lVar10] + local_e8[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
        }
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_f0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  RVar13 = Snapshot::getVolume(this->info_->sman_->currentSnapshot_);
  if (local_78._0_1_ == '\0') {
    RVar13 = RVar13 * 3.0;
  }
  else {
    iVar8 = SUB84(local_88,0);
    local_e8[((iVar8 + 1) / 3) * -3 + iVar8 + 1] = 0.0;
    local_e8[((iVar8 + 2) / 3) * -3 + iVar8 + 2] = 0.0;
  }
  dVar14 = 0.0;
  lVar10 = 0;
  do {
    dVar14 = dVar14 + local_e8[lVar10] * local_e8[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  *local_68 = (6.283185307179586 / RVar13) * 332.0637778 * dVar14 + *local_68;
  pMVar9 = SimInfo::beginMolecule(this->info_,&local_f0);
  if (pMVar9 != (Molecule *)0x0) {
    dVar14 = (6.283185307179586 / RVar13) * -332.0637778;
    dVar14 = dVar14 + dVar14;
    local_68 = (double *)local_e8[1];
    uStack_60 = (undefined4)local_d8;
    uStack_5c = local_d8._4_4_;
    local_78 = local_e8[0];
    uStack_70 = 0;
    local_88 = local_d8;
    dStack_80 = local_e8[0];
    do {
      for (ppAVar12 = (pMVar9->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          (ppAVar12 !=
           (pMVar9->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
           _M_impl.super__Vector_impl_data._M_finish && (pAVar3 = *ppAVar12, pAVar3 != (Atom *)0x0))
          ; ppAVar12 = ppAVar12 + 1) {
        local_108[0] = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 0.0;
        lVar10 = 0;
        do {
          local_108[lVar10] = local_e8[lVar10] * dVar14;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 3);
        local_128[2] = local_108[2];
        local_128[0] = local_108[0];
        local_128[1] = local_108[1];
        lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_ * 0x18 +
                 *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                  atomData).electricField.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start +
                          (pAVar3->super_StuntDouble).storage_);
        lVar11 = 0;
        do {
          *(double *)(lVar10 + lVar11 * 8) = local_128[lVar11] + *(double *)(lVar10 + lVar11 * 8);
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        iVar8 = AtomType::getIdent(pAVar3->atomType_);
        pEVar4 = (this->ElectrostaticMap).
                 super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8];
        bVar2 = pEVar4[iVar8].is_Dipole;
        if ((pEVar4[iVar8].is_Charge & 1U) != 0) {
          RVar13 = pEVar4[iVar8].fixedCharge;
          if ((pEVar4[iVar8].is_Fluctuating & 1U) != 0) {
            lVar11 = (long)(pAVar3->super_StuntDouble).localIndex_;
            lVar10 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar3->super_StuntDouble).storage_);
            pdVar1 = (double *)(lVar10 + lVar11 * 0x18);
            local_c8.super_Vector<double,_3U>.data_[0] = *pdVar1;
            local_c8.super_Vector<double,_3U>.data_[1] = pdVar1[1];
            local_c8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar10 + 0x10 + lVar11 * 0x18);
            local_50 = pEVar4[iVar8].fixedCharge;
            Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_c8);
            dVar7 = 0.0;
            lVar10 = 0;
            do {
              dVar7 = dVar7 + local_c8.super_Vector<double,_3U>.data_[lVar10] * local_e8[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar10 != 3);
            lVar11 = (long)(pAVar3->super_StuntDouble).localIndex_;
            lVar10 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).flucQFrc.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                              (pAVar3->super_StuntDouble).storage_);
            *(double *)(lVar10 + lVar11 * 8) = dVar7 * dVar14 + *(double *)(lVar10 + lVar11 * 8);
            RVar13 = local_50;
          }
          local_108[0] = 0.0;
          local_108[1] = 0.0;
          local_108[2] = 0.0;
          lVar10 = 0;
          do {
            local_108[lVar10] = local_e8[lVar10] * RVar13 * dVar14;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_128[2] = local_108[2];
          local_128[0] = local_108[0];
          local_128[1] = local_108[1];
          lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).force.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar3->super_StuntDouble).storage_);
          lVar11 = 0;
          do {
            *(double *)(lVar10 + lVar11 * 8) = local_128[lVar11] + *(double *)(lVar10 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
        }
        if ((bVar2 & 1U) != 0) {
          lVar11 = (long)(pAVar3->super_StuntDouble).localIndex_;
          lVar10 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).dipole.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar3->super_StuntDouble).storage_);
          local_108[2] = (double)*(undefined8 *)(lVar10 + 0x10 + lVar11 * 0x18);
          pdVar1 = (double *)(lVar10 + lVar11 * 0x18);
          local_108[0] = *pdVar1;
          local_108[1] = pdVar1[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar10 = 0;
          do {
            local_128[lVar10] = local_108[lVar10] * 0.20819434;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_a8[2] = local_128[2];
          local_a8[0] = local_128[0];
          local_a8[1] = local_128[1];
          local_108[0] = local_128[1] * local_88 - local_128[2] * (double)local_68;
          local_108[1] = local_128[2] * dStack_80 -
                         local_128[0] * (double)CONCAT44(uStack_5c,uStack_60);
          local_108[2] = local_128[0] * (double)local_68 - local_78 * local_128[1];
          local_128[0] = 0.0;
          local_128[1] = 0.0;
          local_128[2] = 0.0;
          lVar10 = 0;
          do {
            local_128[lVar10] = local_108[lVar10] * dVar14;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_48[2] = local_128[2];
          local_48[0] = local_128[0];
          local_48[1] = local_128[1];
          lVar10 = (long)(pAVar3->super_StuntDouble).localIndex_ * 0x18 +
                   *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).torque.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar3->super_StuntDouble).storage_);
          lVar11 = 0;
          do {
            *(double *)(lVar10 + lVar11 * 8) = local_48[lVar11] + *(double *)(lVar10 + lVar11 * 8);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
        }
      }
      pMVar9 = SimInfo::nextMolecule(this->info_,&local_f0);
    } while (pMVar9 != (Molecule *)0x0);
  }
  return;
}

Assistant:

void Electrostatic::calcSurfaceTerm(bool slabGeometry, int axis,
                                      RealType& pot) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    RealType C;
    Vector3d r;
    Vector3d D;
    Vector3d t;
    Vector3d netDipole(0.0);
    int atid;
    ElectrostaticAtomData data;

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    if (!initialized_) initialize();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) C += atom->getFlucQPos();

          r = atom->getPos();
          info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

          netDipole += C * r;
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          netDipole += D;
        }
      }
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, netDipole.getArrayPointer(), 3, MPI_REALTYPE,
                  MPI_SUM, MPI_COMM_WORLD);
#endif

    RealType V = info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();
    RealType prefactor;

    if (slabGeometry) {
      prefactor = 2.0 * Constants::PI / V;
      // Compute complementary axes to the privileged axis
      int axis1        = (axis + 1) % 3;
      int axis2        = (axis + 2) % 3;
      netDipole[axis1] = 0.0;
      netDipole[axis2] = 0.0;
    } else {
      prefactor = 2.0 * Constants::PI / (3.0 * V);
    }

    pot += eConverter * prefactor * netDipole.lengthSquare();

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        atom->addElectricField(-eConverter * prefactor * 2.0 * netDipole);

        atid = atom->getAtomType()->getIdent();
        data = ElectrostaticMap[Etids[atid]];

        if (data.is_Charge) {
          C = data.fixedCharge;
          if (data.is_Fluctuating) {
            r = atom->getPos();
            info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);
            atom->addFlucQFrc(-eConverter * prefactor * 2.0 *
                              dot(r, netDipole));
          }
          atom->addFrc(-eConverter * prefactor * 2.0 * C * netDipole);
        }

        if (data.is_Dipole) {
          D = atom->getDipole() * mPoleConverter;
          t = -eConverter * prefactor * 2.0 * cross(D, netDipole);
          atom->addTrq(t);
        }
      }
    }
  }